

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall Liby::Connection::handleReadEvent(Connection *this)

{
  Buffer *this_00;
  long lVar1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  ulong n;
  long *in_FS_OFFSET;
  shared_ptr<Liby::Connection> x;
  iovec iov [2];
  __shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> a_Stack_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  iovec local_48;
  char *local_38;
  undefined8 local_30;
  
  this_00 = &this->readBuf_;
  local_48.iov_base = Buffer::wdata(this_00);
  local_48.iov_len = Buffer::availbleSize(this_00);
  lVar1 = *in_FS_OFFSET;
  local_30 = 0x4000;
  local_38 = (char *)(lVar1 + -0x4000);
  sVar2 = readv(((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->fd_,&local_48,2);
  uVar4 = (uint)sVar2;
  if ((int)uVar4 < 1) {
    if ((uVar4 != 0) && (piVar3 = __errno_location(), *piVar3 == 0xb)) {
      return;
    }
    handleErroEvent(this);
  }
  else {
    n = (ulong)(uVar4 & 0x7fffffff);
    if (local_48.iov_len < n) {
      Buffer::append(this_00,local_48.iov_len);
      Buffer::append(this_00,(char *)(lVar1 + -0x4000),n - local_48.iov_len);
    }
    else {
      Buffer::append(this_00,n);
    }
    if ((this->readEventCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Liby::Connection,void>
                (a_Stack_58,
                 (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<Liby::Connection>);
      if ((this->readEventCallback_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->readEventCallback_)._M_invoker)((_Any_data *)&this->readEventCallback_,this);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
    }
  }
  return;
}

Assistant:

void Connection::handleReadEvent() {
    Buffer &buffer = readBuf_;

    struct iovec iov[2];
    iov[0].iov_base = buffer.wdata();
    iov[0].iov_len = buffer.availbleSize();
    iov[1].iov_base = extraBuffer;
    iov[1].iov_len = sizeof(extraBuffer);

    int ret = socket_->readv(iov, 2);

    if (ret > 0) {
        if (static_cast<decltype(iov[0].iov_len)>(ret) > iov[0].iov_len) {
            buffer.append(iov[0].iov_len);
            buffer.append(extraBuffer, ret - iov[0].iov_len);
        } else {
            buffer.append(ret);
        }
    } else {
        if (ret != 0 && errno == EAGAIN) {
            return;
        } else {
            handleErroEvent();
            return;
        }
    }

    if (readEventCallback_) {
        auto x = shared_from_this();
        readEventCallback_(*this);
    }
}